

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dB-hash.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  string in;
  string pattern;
  string out;
  string local_590;
  string local_570;
  string local_550;
  DBhash dBhash;
  vector<unsigned_long,_std::allocator<unsigned_long>_> occ;
  
  if (argc != 4) {
    std::operator<<((ostream *)&std::cout,"*** dB-hash data structure ***\n");
    std::operator<<((ostream *)&std::cout,"Usage: dB-hash option file [pattern] [pattern_length]\n")
    ;
    std::operator<<((ostream *)&std::cout,"where: \n");
    std::operator<<((ostream *)&std::cout,"- option = build|search.\n");
    std::operator<<((ostream *)&std::cout,
                    "- file = path of the text file (if build mode) or dB-hash .dbh file (if search mode). \n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- pattern_length = In build mode, specify this parameter, which is the pattern length\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "- pattern = must be specified in search mode. It is the pattern to be searched in the index.\n"
                   );
LAB_00113e47:
    exit(0);
  }
  std::__cxx11::string::string((string *)&dBhash,argv[1],(allocator *)&occ);
  iVar1 = std::__cxx11::string::compare((char *)&dBhash);
  std::__cxx11::string::~string((string *)&dBhash);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&dBhash,argv[1],(allocator *)&occ);
    iVar2 = std::__cxx11::string::compare((char *)&dBhash);
    std::__cxx11::string::~string((string *)&dBhash);
    if (iVar2 != 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Unrecognized option ");
      poVar4 = std::operator<<(poVar4,argv[1]);
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_00113e47;
    }
  }
  std::__cxx11::string::string((string *)&in,argv[2],(allocator *)&dBhash);
  std::__cxx11::string::string((string *)&out,(string *)&in);
  std::__cxx11::string::append((char *)&out);
  pattern._M_dataplus._M_p = (pointer)&pattern.field_2;
  pattern._M_string_length = 0;
  pattern.field_2._M_local_buf[0] = '\0';
  if (iVar1 == 0) {
    uVar7 = atoi(argv[3]);
  }
  else {
    std::__cxx11::string::string((string *)&dBhash,argv[3],(allocator *)&occ);
    std::__cxx11::string::operator=((string *)&pattern,(string *)&dBhash);
    std::__cxx11::string::~string((string *)&dBhash);
    uVar7 = (uint)pattern._M_string_length;
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  dBhash.indexedBWT.bwt_wt.nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dBhash.h.Z.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dBhash.h.Z_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.h.Z_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.h.Z_size.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dBhash.h.code.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.h.code.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.h.code.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dBhash.h.random_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.h.random_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.h.random_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dBhash.h.Z.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.h.Z.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.indexedBWT.bwt_wt.nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.indexedBWT.bwt_wt.nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.indexedBWT.marked_positions.n = 0;
  dBhash.indexedBWT.marked_positions.bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dBhash.indexedBWT.marked_positions.bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dBhash.indexedBWT.marked_positions.bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  dBhash.indexedBWT.marked_positions.bitvector.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._2_6_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start._0_2_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start._2_6_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_2_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish._2_6_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_2_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_1.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._2_6_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start._2_6_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish._0_2_ = 0;
  dBhash.indexedBWT.marked_positions.rank_ptrs_2.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._10_8_ = 0;
  dBhash.indexedBWT.marked_positions._74_8_ = 0;
  dBhash.indexedBWT.marked_positions._82_8_ = 0;
  dBhash.text_wv._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.text_wv._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dBhash.text_wv._size = 0;
  dBhash.indexedBWT.text_pointers._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dBhash.indexedBWT.text_pointers._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dBhash.indexedBWT.text_pointers._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dBhash.indexedBWT.text_pointers._size = 0;
  dBhash.indexedBWT.text_pointers._width = 0;
  dBhash.indexedBWT.text_pointers._field_mask = 0;
  dBhash.indexedBWT.FIRST.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.indexedBWT.FIRST.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.indexedBWT.FIRST.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dBhash.indexedBWT.remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.indexedBWT.remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.indexedBWT.remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dBhash.indexedBWT.inverse_remapping.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dBhash.indexedBWT.inverse_remapping.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dBhash.indexedBWT.inverse_remapping.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dBhash.text_wv._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.text_wv._width = 0;
  dBhash.text_wv._field_mask = 0;
  dBhash.auxiliary_hash._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  dBhash.auxiliary_hash._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dBhash.auxiliary_hash._bits._container.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  dBhash.auxiliary_hash._size = 0;
  dBhash.auxiliary_hash._width = 0;
  dBhash.auxiliary_hash._field_mask = 0;
  dBhash.char_to_int.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.char_to_int.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.char_to_int.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dBhash.int_to_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dBhash.int_to_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dBhash.int_to_char.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar1 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Building dB-hash of file ");
    poVar4 = std::operator<<(poVar4,(string *)&in);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string((string *)&local_550,(string *)&in);
    buildFromFile((DBhash *)&occ,&local_550,uVar7);
    bwtil::DBhash::operator=(&dBhash,(DBhash *)&occ);
    bwtil::DBhash::~DBhash((DBhash *)&occ);
    std::__cxx11::string::~string((string *)&local_550);
    poVar4 = std::operator<<((ostream *)&std::cout,"\nStoring dB-hash in ");
    poVar4 = std::operator<<(poVar4,(string *)&out);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string((string *)&local_570,(string *)&out);
    bwtil::DBhash::saveToFile(&dBhash,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::operator<<((ostream *)&std::cout,"Done.\n");
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Loading dB-hash from file ");
    poVar4 = std::operator<<(poVar4,(string *)&in);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::string((string *)&local_590,(string *)&in);
    bwtil::DBhash::loadFromFile((DBhash *)&occ,&local_590);
    bwtil::DBhash::operator=(&dBhash,(DBhash *)&occ);
    bwtil::DBhash::~DBhash((DBhash *)&occ);
    std::__cxx11::string::~string((string *)&local_590);
    poVar4 = std::operator<<((ostream *)&std::cout,"Done.");
    std::endl<char,std::char_traits<char>>(poVar4);
    if (dBhash.m != uVar7) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Error: structure built with pattern length ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,", but now searching a pattern of length ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::endl<char,std::char_traits<char>>(poVar4);
      exit(1);
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"\nSearching pattern ");
    poVar4 = std::operator<<(poVar4,(string *)&pattern);
    std::endl<char,std::char_traits<char>>(poVar4);
    bwtil::DBhash::getOccurrencies(&occ,&dBhash,&pattern,0);
    poVar4 = std::operator<<((ostream *)&std::cout,"The pattern occurs ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::operator<<(poVar4," times in the text at the following positions : \n");
    for (uVar7 = 0;
        (ulong)uVar7 <
        (ulong)((long)occ.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)occ.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&occ,(ulong)uVar7);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar4," ");
    }
    std::operator<<((ostream *)&std::cout,"\n\nDone.\n");
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&occ.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  bwtil::printRSSstat();
  lVar5 = std::chrono::_V2::system_clock::now();
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (double)(lVar5 - lVar3) * 1e-09;
  uVar6 = vcvttsd2usi_avx512f(auVar8);
  if (uVar6 < 0xe10) {
    if (uVar6 < 0x3c) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Total time: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"s");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Total time: ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"m ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"s");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Total time: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"h ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"m ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"s");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  bwtil::DBhash::~DBhash(&dBhash);
  std::__cxx11::string::~string((string *)&pattern);
  std::__cxx11::string::~string((string *)&out);
  std::__cxx11::string::~string((string *)&in);
  return 0;
}

Assistant:

int main(int argc,char** argv) {

	if(argc != 4){
		cout << "*** dB-hash data structure ***\n";
		cout << "Usage: dB-hash option file [pattern] [pattern_length]\n";
		cout << "where: \n";
		cout <<	"- option = build|search.\n";
		cout <<	"- file = path of the text file (if build mode) or dB-hash .dbh file (if search mode). \n";
		cout << "- pattern_length = In build mode, specify this parameter, which is the pattern length\n";
		cout << "- pattern = must be specified in search mode. It is the pattern to be searched in the index.\n";
		exit(0);
	}

    using std::chrono::high_resolution_clock;
    using std::chrono::duration_cast;
    using std::chrono::duration;

	int build=0,search=1;

	int mode;

	if(string(argv[1]).compare("build")==0)
		mode=build;
	else if(string(argv[1]).compare("search")==0)
		mode=search;
	else{
		cout << "Unrecognized option "<<argv[1]<<endl;
		exit(0);
	}

	string in = string(argv[2]);
	string out = string(in);
	out.append(".dbh");

	uint m;

	string pattern;

	if(mode==search){
		pattern = string(argv[3]);
		m = pattern.length();
	}

	if(mode==build)
		m = atoi(argv[3]);

    auto t1 = high_resolution_clock::now();

	DBhash dBhash;

	if(mode==build){


		cout << "Building dB-hash of file "<< in << endl;
		dBhash = buildFromFile(in,m);

		cout << "\nStoring dB-hash in "<< out<<endl;
		dBhash.saveToFile(out);

		cout << "Done.\n";

	}

	if(mode==search){

		cout << "Loading dB-hash from file "<< in <<endl;
		dBhash = DBhash::loadFromFile(in);
		cout << "Done." << endl;

		if(dBhash.patternLength()!=m){
			cout << "Error: structure built with pattern length " << dBhash.patternLength() << ", but now searching a pattern of length " << m << endl;
			exit(1);
		}

		cout << "\nSearching pattern "<< pattern <<endl;

		vector<ulint> occ = dBhash.getOccurrencies( pattern );

		cout << "The pattern occurs " << occ.size() << " times in the text at the following positions : \n";

		for(uint i=0;i<occ.size();i++)
			cout << occ.at(i) << " ";

		cout << "\n\nDone.\n";

	}

	printRSSstat();
	auto t2 = high_resolution_clock::now();
	ulint total = duration_cast<duration<double, std::ratio<1>>>(t2 - t1).count();

	if(total>=3600){

		uint h = total/3600;
		uint m = (total%3600)/60;
		uint s = (total%3600)%60;

		cout << "Total time: " << h << "h " << m << "m " << s << "s" << endl;

	}else if (total>=60){

		uint m = total/60;
		uint s = total%60;

		cout << "Total time: " << m << "m " << s << "s" << endl;

	}else{

		cout << "Total time: " << total << "s" << endl;

	}
}